

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  undefined8 uVar4;
  double *draw_points;
  double *points_x;
  double *points_y;
  double *points_z;
  ostream *poVar5;
  long *plVar6;
  int iVar7;
  size_type *psVar8;
  uint __len;
  _Alloc_hider _Var9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dist;
  double dVar14;
  double dVar15;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  int num_draw_points;
  int num_small_lig;
  double beam_rad;
  string path_2;
  double local_320;
  int num_itr;
  int num_points;
  string str_1;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  string path;
  string __str_1;
  int reg_type;
  string str;
  ios_base local_138 [264];
  
  draw_points = (double *)operator_new__(480000000);
  num_draw_points = 0;
  reg_type = 1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"What strructure you want in the cube? \n",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter (1) for  Honeycomb Structure \n",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter (2) for  Irregular Voronoi Structure \n",0x2c);
  std::istream::operator>>((istream *)&std::cin,&reg_type);
  num_points = 0x22f;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter the number of seeds you want inside the unite cube \n",
             0x3a);
  std::istream::operator>>((istream *)&std::cin,&num_points);
  num_itr = 1;
  beam_rad = 0.0;
  num_small_lig = 0;
  dVar13 = pow((_x0 * _x0 * _x0) / ((double)num_points * 1.4142135623730951),0.3333333333333333);
  iVar7 = reg_type;
  iVar11 = num_points;
  uVar12 = 0xffffffffffffffff;
  if (-1 < (long)num_points) {
    uVar12 = (long)num_points * 8;
  }
  points_x = (double *)operator_new__(uVar12);
  points_y = (double *)operator_new__(uVar12);
  points_z = (double *)operator_new__(uVar12);
  if (iVar7 == 1) {
    regular_points_seeds(points_x,points_y,points_z,dist);
    tet_gen_honeycomb(iVar11,points_x,points_y,points_z,&beam_rad,0.03,&num_draw_points,draw_points)
    ;
    str._M_dataplus._M_p = (pointer)&str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&str,"../output/00_Drawing.dxf","");
    draw_cells(draw_points,num_draw_points,&str);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"beam_rad\t:",10);
    dVar13 = beam_rad;
    poVar5 = std::ostream::_M_insert<double>(beam_rad);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tinch",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"beam_diameter\t:",0xf)
    ;
    poVar5 = std::ostream::_M_insert<double>(dVar13 * 0.0254 + dVar13 * 0.0254);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tm",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    operator_delete__(points_x);
    str_1.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity;
    _Var9 = str._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str._M_dataplus._M_p == &str.field_2) {
      return 0;
    }
  }
  else {
    str_1._M_dataplus._M_p = (pointer)&str_1.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&str_1,"../output/","");
    uVar4 = _memcpy;
    pcVar3 = _VTT;
    local_2b8 = 0.0;
    uVar12 = 0;
    local_2c0 = 0.0;
    local_2c8 = 0.0;
    local_2d0 = 0.0;
    local_2d8 = 0.0;
    do {
      num_itr = 0;
      uVar10 = (ulong)(uint)(&DAT_00177300)[uVar12];
      mps_3d_for_high_regularity
                (points_x,points_y,points_z,num_points,dVar13 * 1.224744871391589 * 0.9,&num_itr,
                 (&DAT_00177300)[uVar12]);
      __len = 2 - (uVar12 < 10);
      iVar11 = 2;
      do {
        dVar14 = 0.01;
        if (iVar11 != 2) {
          dVar14 = local_320;
        }
        dVar15 = 0.03;
        if (iVar11 != 1) {
          dVar15 = dVar14;
        }
        dVar14 = 0.05;
        if (iVar11 != 0) {
          dVar14 = dVar15;
        }
        dVar15 = 0.07;
        if (iVar11 != -1) {
          dVar15 = dVar14;
        }
        local_320 = 0.09;
        if (iVar11 != -2) {
          local_320 = dVar15;
        }
        tet_gen(num_points,points_x,points_y,points_z,&beam_rad,local_320,dVar15,in_XMM2_Qa,
                (int)uVar10,in_XMM3_Qa,&num_small_lig,&num_draw_points,draw_points);
        if (iVar11 == 2) {
          local_2d8 = local_2d8 + beam_rad;
        }
        path_2._M_dataplus._M_p = (pointer)&path_2.field_2;
        iVar7 = iVar11 + -1;
        if (iVar7 == 0) {
          local_2d0 = local_2d0 + beam_rad;
        }
        if (iVar11 == 0) {
          local_2c8 = local_2c8 + beam_rad;
        }
        if (iVar11 == -1) {
          local_2c0 = local_2c0 + beam_rad;
        }
        if (iVar11 == -2) {
          local_2b8 = local_2b8 + beam_rad;
        }
        std::__cxx11::string::_M_construct((ulong)&path_2,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>(path_2._M_dataplus._M_p,__len,(uint)uVar12);
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)&path_2,0,(char *)0x0,(ulong)str_1._M_dataplus._M_p);
        paVar1 = &str.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          str.field_2._M_allocated_capacity = *psVar8;
          str.field_2._8_8_ = plVar6[3];
          str._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          str.field_2._M_allocated_capacity = *psVar8;
          str._M_dataplus._M_p = (pointer)*plVar6;
        }
        str._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&str);
        path._M_dataplus._M_p = (pointer)&path.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          path.field_2._M_allocated_capacity = *psVar8;
          path.field_2._8_8_ = plVar6[3];
        }
        else {
          path.field_2._M_allocated_capacity = *psVar8;
          path._M_dataplus._M_p = (pointer)*plVar6;
        }
        path._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != paVar1) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)path_2._M_dataplus._M_p != &path_2.field_2) {
          operator_delete(path_2._M_dataplus._M_p,path_2.field_2._M_allocated_capacity + 1);
        }
        if (iVar11 == 2) {
          draw_cells(draw_points,num_draw_points,&path);
        }
        __str_1._M_dataplus._M_p = (pointer)&__str_1.field_2;
        std::__cxx11::string::_M_construct((ulong)&__str_1,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>(__str_1._M_dataplus._M_p,__len,(uint)uVar12)
        ;
        plVar6 = (long *)std::__cxx11::string::replace
                                   ((ulong)&__str_1,0,(char *)0x0,(ulong)str_1._M_dataplus._M_p);
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          str.field_2._M_allocated_capacity = *psVar8;
          str.field_2._8_8_ = plVar6[3];
          str._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          str.field_2._M_allocated_capacity = *psVar8;
          str._M_dataplus._M_p = (pointer)*plVar6;
        }
        str._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        plVar6 = (long *)std::__cxx11::string::append((char *)&str);
        path_2._M_dataplus._M_p = (pointer)&path_2.field_2;
        psVar8 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar8) {
          path_2.field_2._M_allocated_capacity = *psVar8;
          path_2.field_2._8_8_ = plVar6[3];
        }
        else {
          path_2.field_2._M_allocated_capacity = *psVar8;
          path_2._M_dataplus._M_p = (pointer)*plVar6;
        }
        path_2._M_string_length = plVar6[1];
        *plVar6 = (long)psVar8;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)str._M_dataplus._M_p != paVar1) {
          operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str_1._M_dataplus._M_p != &__str_1.field_2) {
          operator_delete(__str_1._M_dataplus._M_p,__str_1.field_2._M_allocated_capacity + 1);
        }
        cVar2 = (char)&str;
        if (iVar11 == 2) {
          std::ofstream::ofstream(&str,(string *)&path_2,_S_out);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"denesity\t",9);
          poVar5 = std::ostream::_M_insert<double>(local_320);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"beam_rad\t",9);
          poVar5 = std::ostream::_M_insert<double>(beam_rad);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tinch",5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"num_small_lig\t",0xe);
          plVar6 = (long *)std::ostream::operator<<((ostream *)&str,num_small_lig);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"regularity\t",0xb);
          poVar5 = std::ostream::_M_insert<double>(0.9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&str,"***********************",0x17);
          std::ios::widen((char)*(undefined8 *)(str._M_dataplus._M_p + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        else {
          std::ofstream::ofstream(&str,(string *)&path_2,_S_app);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"denesity\t",9);
          poVar5 = std::ostream::_M_insert<double>(local_320);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"beam_rad\t",9);
          poVar5 = std::ostream::_M_insert<double>(beam_rad);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tinch",5);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"num_small_lig\t",0xe);
          plVar6 = (long *)std::ostream::operator<<((ostream *)&str,num_small_lig);
          std::ios::widen((char)*(undefined8 *)(*plVar6 + -0x18) + (char)plVar6);
          std::ostream::put((char)plVar6);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"regularity\t",0xb);
          poVar5 = std::ostream::_M_insert<double>(0.9);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
          std::ostream::put((char)poVar5);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&str,"***********************",0x17);
          std::ios::widen((char)*(undefined8 *)(str._M_dataplus._M_p + -0x18) + cVar2);
          std::ostream::put(cVar2);
          std::ostream::flush();
        }
        str._M_dataplus._M_p = pcVar3;
        *(undefined8 *)((long)&str._M_dataplus._M_p + *(long *)(pcVar3 + -0x18)) = uVar4;
        std::filebuf::~filebuf((filebuf *)&str._M_string_length);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)path_2._M_dataplus._M_p != &path_2.field_2) {
          operator_delete(path_2._M_dataplus._M_p,path_2.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)path._M_dataplus._M_p != &path.field_2) {
          operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
        }
        iVar11 = iVar7;
      } while (iVar7 != -3);
      uVar12 = uVar12 + 1;
    } while (uVar12 != 0x14);
    std::ofstream::ofstream(&str,"../output/mean_beam_radius.txt",_S_out);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"regularity\t",0xb);
    poVar5 = std::ostream::_M_insert<double>(0.9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"m_rad_1\t",8);
    poVar5 = std::ostream::_M_insert<double>(local_2d8 / 20.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"m_rad_3\t",8);
    poVar5 = std::ostream::_M_insert<double>(local_2d0 / 20.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"m_rad_5\t",8);
    poVar5 = std::ostream::_M_insert<double>(local_2c8 / 20.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"m_rad_7\t",8);
    poVar5 = std::ostream::_M_insert<double>(local_2c0 / 20.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&str,"m_rad_9\t",8);
    poVar5 = std::ostream::_M_insert<double>(local_2b8 / 20.0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    operator_delete__(points_x);
    str._M_dataplus._M_p = pcVar3;
    *(undefined8 *)((long)&str._M_dataplus._M_p + *(long *)(pcVar3 + -0x18)) = uVar4;
    std::filebuf::~filebuf((filebuf *)&str._M_string_length);
    std::ios_base::~ios_base(local_138);
    _Var9 = str_1._M_dataplus;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)str_1._M_dataplus._M_p == &str_1.field_2) {
      return 0;
    }
  }
  operator_delete(_Var9._M_p,str_1.field_2._M_allocated_capacity + 1);
  return 0;
}

Assistant:

int main()
{
	// creat array that holds voroni vertices
	double *draw_points;
	draw_points = new double[60000000];
	int num_draw_points = 0;

	//Create a parameter to check whether the user want to generate a honeycomb structure 1 or random voronoi diagram
	int reg_type = 1;
	cout << "What strructure you want in the cube? \n";
	cout << "Enter (1) for  Honeycomb Structure \n";
	cout << "Enter (2) for  Irregular Voronoi Structure \n";
	cin >> reg_type;

	//the required number of seed inside the unite cube
	int num_points = 559;
	cout << "Enter the number of seeds you want inside the unite cube \n";
	cin >> num_points;

	int num_itr = 1;
	double *points_x, *points_y, *points_z;

	// Create variables that holds Vornoi ligaments characteristics
	double beam_rad = 0.0;
	int num_small_lig = 0;
	double denesity;

	// calculate the required distance to generate complete regulare voronoi structure for "num_points" seeds in unite cube "_x0*_x0*_x0"
	double r_reg;
	r_reg = min_dist_req_3d(_x0 * _x0 * _x0, num_points);

	//in case of user want to generate complete regulare structure "honeycomb"
	if (reg_type == 1)
	{
		// set the the required density of model
		denesity = 0.03;

		// Create arrays holds seeds coordinates
		points_x = new double[num_points];
		points_y = new double[num_points];
		points_z = new double[num_points];

		// generate regulare distribution seeds
		regular_points_seeds(points_x, points_y, points_z, r_reg);

		// Creating Vornoi vertices for honeycomb structure using TetGen library
		tet_gen_honeycomb(num_points, points_x, points_y, points_z, beam_rad, denesity, num_draw_points, draw_points);

		//set the destination for storing DXF file
		string str = "../output/00_Drawing.dxf";

		// Draw Honeycomb structure in dxf file
		draw_cells(draw_points, num_draw_points, str);

		//display voronoi ligaments radiaus in inch and in m
		cout << "beam_rad	:" << beam_rad << "	inch" << endl;
		cout << "beam_diameter	:" << beam_rad * .0254 * 2 << "	m" << endl;

		delete[] points_x, points_y, points_z;
	}
	//in case of user want to generete random distributing voronoi
	else
	{
		// random number geration function initiation
		int initiation = 0;

		//Regularity parameter 0 % complete irrigulare structure and 100% is honeycomb structure
		double e = 0.9;

		//these values are evaluated from running the code before. the code converge more quicly when srand() functions initiated with these values
		int good_initiation[20] = {2, 28, 29, 37, 45, 56, 70, 95, 104, 126, 162, 178, 205, 229, 243, 268, 309, 322, 326, 357};

		//create arrays holps seeds coordinates
		points_x = new double[num_points];
		points_y = new double[num_points];
		points_z = new double[num_points];

		//location where the Dxf file and statistics .txt will be stored
		string str = "../output/";

		// this variable will hold density itration
		int e_itra = 0;
		double m_rad_1 = 0.0, m_rad_3 = 0.0, m_rad_5 = 0.0, m_rad_7 = 0.0, m_rad_9 = 0.0;

		//we need to generate 20 model automatically and store them in different distinations
		while (initiation < 20)
		{
			e_itra = 0;
			num_itr = 0;

			//use the modified MPS to generate vornoi with regularity 90%
			mps_3d_for_high_regularity(points_x, points_y, points_z, num_points, e * r_reg, num_itr, good_initiation[initiation]);
			//mps_3d(points_x,points_y,points_z, num_points, e*r_reg,num_itr,initiation);

			while (e_itra < 5)
			{
				if (e_itra == 0)
					denesity = .01;
				if (e_itra == 1)
					denesity = .03;
				if (e_itra == 2)
					denesity = .05;
				if (e_itra == 3)
					denesity = .07;
				if (e_itra == 4)
					denesity = .09;

				// Get Vornoi vertices using TetGen library
				tet_gen(num_points, points_x, points_y, points_z, beam_rad, denesity, r_reg, e, initiation, e * r_reg, num_small_lig, num_draw_points, draw_points);

				// sum the beam diameter for every density and at the end calculate the mean for 20 model
				if (e_itra == 0)
					m_rad_1 = m_rad_1 + beam_rad;
				if (e_itra == 1)
					m_rad_3 = m_rad_3 + beam_rad;
				if (e_itra == 2)
					m_rad_5 = m_rad_5 + beam_rad;
				if (e_itra == 3)
					m_rad_7 = m_rad_7 + beam_rad;
				if (e_itra == 4)
					m_rad_9 = m_rad_9 + beam_rad;

				// Draw Voronoi Seeds for the first itration of densities as the structure will not change by changing densities
				// only Vornoi legaments diameter will change
				string path = str + to_string(initiation) + ".dxf";
				if (e_itra == 0)
					draw_cells(draw_points, num_draw_points, path);

				string path_2 = str + to_string(initiation) + ".txt";

				if (e_itra == 0)
				{
					ofstream beam_radius(path_2, ios::out);
					beam_radius << "denesity	" << denesity << endl;
					beam_radius << "beam_rad	" << beam_rad << "	inch" << endl;
					beam_radius << "num_small_lig	" << num_small_lig << endl;
					beam_radius << "regularity	" << e << endl;
					beam_radius << "***********************" << endl;
				}

				else
				{
					ofstream beam_radius(path_2, ios::app);
					beam_radius << "denesity	" << denesity << endl;
					beam_radius << "beam_rad	" << beam_rad << "	inch" << endl;
					beam_radius << "num_small_lig	" << num_small_lig << endl;
					beam_radius << "regularity	" << e << endl;
					beam_radius << "***********************" << endl;
				}

				e_itra++;
			}
			initiation++;
		}

		// calculate the mean of Voronoi ligaments for 20 model and store them in dxf file
		ofstream beam_radius("../output/mean_beam_radius.txt", ios::out);
		beam_radius << "regularity	" << e << endl;
		beam_radius << "m_rad_1	" << m_rad_1 / initiation << endl;
		beam_radius << "m_rad_3	" << m_rad_3 / initiation << endl;
		beam_radius << "m_rad_5	" << m_rad_5 / initiation << endl;
		beam_radius << "m_rad_7	" << m_rad_7 / initiation << endl;
		beam_radius << "m_rad_9	" << m_rad_9 / initiation << endl;

		delete[] points_x, points_y, points_z;
	}
	return 0;
}